

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::StructPackArgs
          (GoGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  FieldDef *pFVar1;
  StructDef *struct_def_00;
  StructDef *pSVar2;
  pointer ppFVar3;
  allocator<char> local_d9;
  StructDef *local_d8;
  IdlNamer *local_d0;
  char *local_c8;
  GoGenerator *local_c0;
  pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = &this->namer_;
  local_d8 = struct_def;
  local_c8 = nameprefix;
  local_c0 = this;
  for (ppFVar3 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pSVar2 = local_d8,
      ppFVar3 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
    pFVar1 = *ppFVar3;
    if ((pFVar1->value).type.base_type == BASE_TYPE_STRUCT) {
      struct_def_00 = (pFVar1->value).type.struct_def;
      local_b8 = ppFVar3;
      (*(local_d0->super_Namer)._vptr_Namer[0x12])(&local_70,local_d0,pFVar1);
      std::operator+(&local_50,local_c8,&local_70);
      std::operator+(&local_b0,&local_50,".");
      StructPackArgs(local_c0,struct_def_00,local_b0._M_dataplus._M_p,code_ptr);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      ppFVar3 = local_b8;
      struct_def = pSVar2;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,", t.",&local_d9);
      std::operator+(&local_50,&local_70,local_c8);
      (*(local_d0->super_Namer)._vptr_Namer[0x12])(&local_90,local_d0,pFVar1);
      std::operator+(&local_b0,&local_50,&local_90);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      struct_def = local_d8;
    }
  }
  return;
}

Assistant:

void StructPackArgs(const StructDef &struct_def, const char *nameprefix,
                      std::string *code_ptr) {
    std::string &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        StructPackArgs(*field.value.type.struct_def,
                       (nameprefix + namer_.Field(field) + ".").c_str(),
                       code_ptr);
      } else {
        code += std::string(", t.") + nameprefix + namer_.Field(field);
      }
    }
  }